

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iris_dataset.cpp
# Opt level: O2

void __thiscall Data::iris_dataset::print_data(iris_dataset *this)

{
  pointer ppiVar1;
  iris_data *__x;
  pointer pdVar2;
  ostream *poVar3;
  pointer ppiVar4;
  pointer pdVar5;
  _Vector_base<double,_std::allocator<double>_> local_50;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Classname\tValues\tTarget");
  std::endl<char,std::char_traits<char>>(poVar3);
  ppiVar1 = (this->dataset_rows).
            super__Vector_base<Data::iris_data_*,_std::allocator<Data::iris_data_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppiVar4 = (this->dataset_rows).
                 super__Vector_base<Data::iris_data_*,_std::allocator<Data::iris_data_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppiVar4 != ppiVar1; ppiVar4 = ppiVar4 + 1) {
    __x = *ppiVar4;
    std::__cxx11::string::string((string *)&local_50,&__x->class_name);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
    std::operator<<(poVar3,"\t");
    std::__cxx11::string::~string((string *)&local_50);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_50,&__x->values);
    pdVar2 = local_50._M_impl.super__Vector_impl_data._M_finish;
    for (pdVar5 = local_50._M_impl.super__Vector_impl_data._M_start; pdVar5 != pdVar2;
        pdVar5 = pdVar5 + 1) {
      printf("%.2f,",*pdVar5);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_50);
    std::operator<<((ostream *)&std::cout,"\t");
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_50,&__x->target);
    pdVar2 = local_50._M_impl.super__Vector_impl_data._M_finish;
    for (pdVar5 = local_50._M_impl.super__Vector_impl_data._M_start; pdVar5 != pdVar2;
        pdVar5 = pdVar5 + 1) {
      poVar3 = std::ostream::_M_insert<double>(*pdVar5);
      std::operator<<(poVar3,", ");
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_50);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  return;
}

Assistant:

void Data::iris_dataset::print_data() {
    std::cout << "Classname\tValues\tTarget" << std::endl;
    for (iris_data *iris : this->dataset_rows) {
        std::cout << iris->get_class_name() << "\t";

        for (double value : iris->get_values())
            printf("%.2f,", value);

        std::cout << "\t";

        for (double target : iris->get_target())
            std::cout << target << ", ";

        std::cout << std::endl;
    }
}